

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O2

bool google::protobuf::compiler::objectivec::ValidateObjCClassPrefixes
               (vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *files,Options *validation_options,string *out_error)

{
  uint uVar1;
  size_type sVar2;
  pointer ppFVar3;
  FileDescriptor *pFVar4;
  basic_string_view<char,_std::char_traits<char>_> __y;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  bool bVar8;
  bool bVar9;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var10;
  undefined8 *puVar11;
  pointer prVar12;
  ostream *poVar13;
  pointer pcVar14;
  AlphaNum *this;
  char *pcVar15;
  AlphaNum *in_R8;
  pointer ppFVar16;
  string_view usage;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  string_view prefix;
  string_view prefix_00;
  string_view prefix_01;
  string_view path;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  string_view text;
  string_view text_00;
  string_view str;
  char (*in_stack_fffffffffffffdf8) [3];
  string other_package_for_prefix;
  const_iterator i;
  basic_string_view<char,_std::char_traits<char>_> local_188;
  const_iterator package_match;
  AlphaNum local_168;
  string lookup_key;
  string_view package;
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  expected_package_prefixes;
  AlphaNum local_e0;
  AlphaNum local_b0;
  string local_80;
  AlphaNum local_60;
  
  bVar7 = std::operator==(&validation_options->expected_prefixes_path,"-");
  if (bVar7) {
    return true;
  }
  expected_package_prefixes.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  expected_package_prefixes.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  expected_package_prefixes.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  sVar2 = (validation_options->expected_prefixes_path)._M_string_length;
  if (sVar2 != 0) {
    pcVar14 = (validation_options->expected_prefixes_path)._M_dataplus._M_p;
    usage._M_str = "Expected prefixes";
    usage._M_len = 0x11;
    anon_unknown_0::PackageToPrefixesCollector::PackageToPrefixesCollector
              ((PackageToPrefixesCollector *)&i,usage,&expected_package_prefixes);
    path._M_str = pcVar14;
    path._M_len = sVar2;
    bVar7 = ParseSimpleFile(path,(LineConsumer *)&i,out_error);
    anon_unknown_0::PackageToPrefixesCollector::~PackageToPrefixesCollector
              ((PackageToPrefixesCollector *)&i);
    if (!bVar7) {
LAB_001806e1:
      bVar7 = false;
      goto LAB_001806e4;
    }
  }
  ppFVar3 = (files->
            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar16 = (files->
                  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start; ppFVar16 != ppFVar3;
      ppFVar16 = ppFVar16 + 1) {
    pFVar4 = *ppFVar16;
    i.inner_.field_1.slot_ = ((anon_union_8_1_a8a14541_for_iterator_2 *)pFVar4->name_)->slot_;
    i.inner_.ctrl_ = (ctrl_t *)((anon_union_8_1_a8a14541_for_iterator_2 *)pFVar4->name_)[1].slot_;
    _Var10 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::basic_string_view<char,std::char_traits<char>>const>>
                       ((validation_options->expected_prefixes_suppressions).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (validation_options->expected_prefixes_suppressions).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,&i.inner_);
    if (_Var10._M_current ==
        (validation_options->expected_prefixes_suppressions).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_188._M_str = (validation_options->expected_prefixes_path)._M_dataplus._M_p;
      sVar2 = (validation_options->expected_prefixes_path)._M_string_length;
      bVar7 = validation_options->prefixes_must_be_registered;
      bVar9 = validation_options->require_prefixes;
      uVar1 = *(uint *)((long)&pFVar4->options_->field_0 + 0x18);
      puVar11 = (undefined8 *)
                ((ulong)(pFVar4->options_->field_0)._impl_.objc_class_prefix_.tagged_ptr_.ptr_ &
                0xfffffffffffffffc);
      pcVar15 = (char *)*puVar11;
      pcVar14 = (pointer)puVar11[1];
      package._M_str = (pFVar4->package_->_M_dataplus)._M_p;
      package._M_len = pFVar4->package_->_M_string_length;
      local_188._M_len = sVar2;
      if (package._M_len == 0) {
        i.inner_.field_1.slot_ = (slot_type *)"no_package:";
        i.inner_.ctrl_ = (ctrl_t *)0xb;
        local_168.piece_._M_str = (pFVar4->name_->_M_dataplus)._M_p;
        local_168.piece_._M_len = pFVar4->name_->_M_string_length;
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&lookup_key,(lts_20250127 *)&i.inner_,&local_168,
                   (AlphaNum *)local_168.piece_._M_str);
      }
      else {
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&lookup_key,&package,(allocator<char> *)&i.inner_);
      }
      package_match.inner_ =
           absl::lts_20250127::container_internal::
           raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::find<std::__cxx11::string>
                     ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                       *)&expected_package_prefixes,&lookup_key);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::AssertNotDebugCapacity
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&expected_package_prefixes);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = i.inner_.field_1;
      i.inner_ = (iterator)(auVar5 << 0x40);
      bVar8 = absl::lts_20250127::container_internal::operator!=
                        (&package_match,(const_iterator *)&i.inner_);
      if (bVar8) {
        if ((uVar1 & 8) != 0) {
          prVar12 = absl::lts_20250127::container_internal::
                    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::iterator::operator->(&package_match.inner_);
          __y._M_str = pcVar15;
          __y._M_len = (size_t)pcVar14;
          __x._M_str = (prVar12->second)._M_dataplus._M_p;
          __x._M_len = (prVar12->second)._M_string_length;
          bVar7 = std::operator==(__x,__y);
          if (bVar7) goto LAB_00180111;
        }
        i.inner_ = (iterator)
                   absl::lts_20250127::NullSafeStringView
                             ("error: Expected \'option objc_class_prefix = \"");
        prVar12 = absl::lts_20250127::container_internal::
                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::iterator::operator->(&package_match.inner_);
        local_168.piece_._M_str = (prVar12->second)._M_dataplus._M_p;
        local_168.piece_._M_len = (prVar12->second)._M_string_length;
        local_e0.piece_ = absl::lts_20250127::NullSafeStringView("\";\'");
        absl::lts_20250127::StrCat_abi_cxx11_
                  ((string *)&local_b0,(lts_20250127 *)&i,&local_168,&local_e0,in_R8);
        std::__cxx11::string::operator=((string *)out_error,(string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        if (package._M_len != 0) {
          i.inner_ = (iterator)absl::lts_20250127::NullSafeStringView(" for package \'");
          local_168.piece_._M_len = package._M_len;
          local_168.piece_._M_str = package._M_str;
          local_e0.piece_ = absl::lts_20250127::NullSafeStringView("\'");
          absl::lts_20250127::StrAppend(out_error,(AlphaNum *)&i,&local_168,&local_e0);
        }
        i.inner_ = (iterator)absl::lts_20250127::NullSafeStringView(" in \'");
        local_168.piece_._M_str = (pFVar4->name_->_M_dataplus)._M_p;
        local_168.piece_._M_len = pFVar4->name_->_M_string_length;
        local_e0.piece_ = absl::lts_20250127::NullSafeStringView("\'");
        absl::lts_20250127::StrAppend(out_error,(AlphaNum *)&i,&local_168,&local_e0);
        if ((uVar1 & 8) != 0) {
          i.inner_ = (iterator)absl::lts_20250127::NullSafeStringView("; but found \'");
          local_168.piece_._M_str = pcVar15;
          local_168.piece_._M_len = (size_t)pcVar14;
          local_e0.piece_ = absl::lts_20250127::NullSafeStringView("\' instead");
          absl::lts_20250127::StrAppend(out_error,(AlphaNum *)&i,&local_168,&local_e0);
        }
        i.inner_ = (iterator)absl::lts_20250127::NullSafeStringView(".");
        absl::lts_20250127::StrAppend(out_error,(AlphaNum *)&i);
      }
      else {
        if ((uVar1 & 8) == 0) {
          if (bVar9 == false) goto LAB_00180111;
          i.inner_ = (iterator)absl::lts_20250127::NullSafeStringView("error: \'");
          local_168.piece_._M_str = (pFVar4->name_->_M_dataplus)._M_p;
          local_168.piece_._M_len = pFVar4->name_->_M_string_length;
          local_e0.piece_ =
               absl::lts_20250127::NullSafeStringView
                         ("\' does not have a required \'option objc_class_prefix\'.");
          absl::lts_20250127::StrCat_abi_cxx11_
                    ((string *)&local_b0,(lts_20250127 *)&i,&local_168,&local_e0,in_R8);
          this = &local_b0;
LAB_00180468:
          std::__cxx11::string::operator=((string *)out_error,(string *)this);
        }
        else {
          if ((sVar2 == 0) || (pcVar14 == (pointer)0x0)) {
LAB_0017ff01:
            if (pcVar14 != (pointer)0x0) {
              if (0x19 < (byte)(*pcVar15 + 0xbfU)) {
                poVar13 = std::operator<<((ostream *)&std::cerr,
                                          "protoc:0: warning: Invalid \'option objc_class_prefix = \""
                                         );
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar13,pcVar15,(long)pcVar14);
                poVar13 = std::operator<<(poVar13,"\";\' in \'");
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar13,(pFVar4->name_->_M_dataplus)._M_p,
                                     pFVar4->name_->_M_string_length);
                poVar13 = std::operator<<(poVar13,"\';");
                poVar13 = std::operator<<(poVar13," it should start with a capital letter.");
                std::endl<char,std::char_traits<char>>(poVar13);
                std::ostream::flush();
              }
              if (pcVar14 < (pointer)0x3) {
                poVar13 = std::operator<<((ostream *)&std::cerr,
                                          "protoc:0: warning: Invalid \'option objc_class_prefix = \""
                                         );
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar13,pcVar15,(long)pcVar14);
                poVar13 = std::operator<<(poVar13,"\";\' in \'");
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar13,(pFVar4->name_->_M_dataplus)._M_p,
                                     pFVar4->name_->_M_string_length);
                poVar13 = std::operator<<(poVar13,"\';");
                poVar13 = std::operator<<(poVar13,
                                          " Apple recommends they should be at least 3 characters long."
                                         );
                std::endl<char,std::char_traits<char>>(poVar13);
                std::ostream::flush();
              }
            }
            if (sVar2 != 0) {
              if (bVar7 != false) {
                i.inner_ = (iterator)absl::lts_20250127::NullSafeStringView("error: \'");
                local_168.piece_._M_str = (pFVar4->name_->_M_dataplus)._M_p;
                local_168.piece_._M_len = pFVar4->name_->_M_string_length;
                local_e0.piece_ =
                     absl::lts_20250127::NullSafeStringView
                               ("\' has \'option objc_class_prefix = \"");
                local_b0.piece_._M_len = (size_t)pcVar14;
                local_b0.piece_._M_str = pcVar15;
                local_60.piece_ =
                     absl::lts_20250127::NullSafeStringView
                               ("\";\', but it is not registered. Add \'");
                local_80._M_dataplus._M_p = (pointer)0x2;
                if (pcVar14 != (pointer)0x0) {
                  local_80._M_dataplus._M_p = pcVar14;
                }
                local_80._M_string_length = (size_type)"\"\"";
                if (pcVar14 != (pointer)0x0) {
                  local_80._M_string_length = (size_type)pcVar15;
                }
                absl::lts_20250127::
                StrCat<std::__cxx11::string,char[4],std::basic_string_view<char,std::char_traits<char>>,char[34],std::basic_string_view<char,std::char_traits<char>>,char[3]>
                          (&other_package_for_prefix,(lts_20250127 *)&i,&local_168,&local_e0,
                           &local_b0,&local_60,(AlphaNum *)&lookup_key,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x4f3969,(char (*) [4])&local_80,
                           (basic_string_view<char,_std::char_traits<char>_> *)
                           "\' to the expected prefixes file (",(char (*) [34])&local_188,
                           (basic_string_view<char,_std::char_traits<char>_> *)0x57d351,
                           in_stack_fffffffffffffdf8);
                this = (AlphaNum *)&other_package_for_prefix;
                goto LAB_00180468;
              }
              poVar13 = std::operator<<((ostream *)&std::cerr,
                                        "protoc:0: warning: Found unexpected \'option objc_class_prefix = \""
                                       );
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar13,pcVar15,(long)pcVar14);
              poVar13 = std::operator<<(poVar13,"\";\' in \'");
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar13,(pFVar4->name_->_M_dataplus)._M_p,
                                   pFVar4->name_->_M_string_length);
              poVar13 = std::operator<<(poVar13,"\'; consider adding \'");
              poVar13 = std::operator<<(poVar13,(string *)&lookup_key);
              poVar13 = std::operator<<(poVar13," = ");
              if (pcVar14 == (pointer)0x0) {
                pcVar15 = "\"\"";
              }
              if (pcVar14 == (pointer)0x0) {
                pcVar14 = (pointer)0x2;
              }
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar13,pcVar15,(long)pcVar14);
              poVar13 = std::operator<<(poVar13,"\' to the expected prefixes file (");
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar13,local_188._M_str,local_188._M_len);
              poVar13 = std::operator<<(poVar13,").");
              std::endl<char,std::char_traits<char>>(poVar13);
              std::ostream::flush();
            }
LAB_00180111:
            std::__cxx11::string::~string((string *)&lookup_key);
            goto LAB_0018011e;
          }
          other_package_for_prefix._M_dataplus._M_p = (pointer)&other_package_for_prefix.field_2;
          other_package_for_prefix._M_string_length = 0;
          other_package_for_prefix.field_2._M_local_buf[0] = '\0';
          i.inner_ = absl::lts_20250127::container_internal::
                     raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::begin((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&expected_package_prefixes);
          while( true ) {
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::AssertNotDebugCapacity
                      ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&expected_package_prefixes);
            auVar6._8_8_ = 0;
            auVar6._0_8_ = local_168.piece_._M_str;
            local_168.piece_ = (string_view)(auVar6 << 0x40);
            bVar9 = absl::lts_20250127::container_internal::operator!=
                              ((const_iterator *)&i.inner_,(const_iterator *)&local_168);
            if (!bVar9) break;
            prVar12 = absl::lts_20250127::container_internal::
                      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::iterator::operator->(&i.inner_);
            __y_00._M_str = pcVar15;
            __y_00._M_len = (size_t)pcVar14;
            __x_00._M_str = (prVar12->second)._M_dataplus._M_p;
            __x_00._M_len = (prVar12->second)._M_string_length;
            bVar9 = std::operator==(__x_00,__y_00);
            if (bVar9) {
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::iterator::operator->(&i.inner_);
              std::__cxx11::string::_M_assign((string *)&other_package_for_prefix);
              prefix._M_str = "no_package:";
              prefix._M_len = 0xb;
              text._M_str = other_package_for_prefix._M_dataplus._M_p;
              text._M_len = other_package_for_prefix._M_string_length;
              bVar9 = absl::lts_20250127::StartsWith(text,prefix);
              if (!bVar9) break;
            }
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::iterator::operator++(&i.inner_);
          }
          if (other_package_for_prefix._M_string_length == 0) {
            std::__cxx11::string::~string((string *)&other_package_for_prefix);
            goto LAB_0017ff01;
          }
          i.inner_ = (iterator)
                     absl::lts_20250127::NullSafeStringView
                               ("error: Found \'option objc_class_prefix = \"");
          local_168.piece_._M_len = (size_t)pcVar14;
          local_168.piece_._M_str = pcVar15;
          local_e0.piece_ = absl::lts_20250127::NullSafeStringView("\";\' in \'");
          local_b0.piece_._M_str = (pFVar4->name_->_M_dataplus)._M_p;
          local_b0.piece_._M_len = pFVar4->name_->_M_string_length;
          local_60.piece_ =
               absl::lts_20250127::NullSafeStringView("\'; that prefix is already used for ");
          absl::lts_20250127::StrCat<>
                    (&local_80,(AlphaNum *)&i,&local_168,&local_e0,&local_b0,&local_60);
          std::__cxx11::string::operator=((string *)out_error,(string *)&local_80);
          std::__cxx11::string::~string((string *)&local_80);
          prefix_00._M_str = "no_package:";
          prefix_00._M_len = 0xb;
          text_00._M_str = other_package_for_prefix._M_dataplus._M_p;
          text_00._M_len = other_package_for_prefix._M_string_length;
          bVar7 = absl::lts_20250127::StartsWith(text_00,prefix_00);
          if (bVar7) {
            i.inner_ = (iterator)absl::lts_20250127::NullSafeStringView("file \'");
            prefix_01._M_str = "no_package:";
            prefix_01._M_len = 0xb;
            str._M_str = other_package_for_prefix._M_dataplus._M_p;
            str._M_len = other_package_for_prefix._M_string_length;
            local_168.piece_ = absl::lts_20250127::StripPrefix(str,prefix_01);
            local_e0.piece_ = absl::lts_20250127::NullSafeStringView("\'.");
            absl::lts_20250127::StrAppend(out_error,(AlphaNum *)&i,&local_168,&local_e0);
          }
          else {
            i.inner_ = (iterator)absl::lts_20250127::NullSafeStringView("\'package ");
            local_168.piece_._M_str = other_package_for_prefix._M_dataplus._M_p;
            local_168.piece_._M_len = other_package_for_prefix._M_string_length;
            local_e0.piece_ = absl::lts_20250127::NullSafeStringView(";\'.");
            absl::lts_20250127::StrAppend(out_error,(AlphaNum *)&i,&local_168,&local_e0);
          }
          i.inner_ = (iterator)
                     absl::lts_20250127::NullSafeStringView(" It can only be reused by adding \'");
          local_168.piece_._M_str = lookup_key._M_dataplus._M_p;
          local_168.piece_._M_len = lookup_key._M_string_length;
          local_e0.piece_ = absl::lts_20250127::NullSafeStringView(" = ");
          local_b0.piece_._M_len = (size_t)pcVar14;
          local_b0.piece_._M_str = pcVar15;
          local_60.piece_ =
               absl::lts_20250127::NullSafeStringView("\' to the expected prefixes file (");
          absl::lts_20250127::StrAppend<std::basic_string_view<char,std::char_traits<char>>,char[3]>
                    (out_error,(AlphaNum *)&i,&local_168,&local_e0,&local_b0,&local_60,&local_188,
                     (char (*) [3])0x57d351);
          this = (AlphaNum *)&other_package_for_prefix;
        }
        std::__cxx11::string::~string((string *)this);
      }
      std::__cxx11::string::~string((string *)&lookup_key);
      goto LAB_001806e1;
    }
LAB_0018011e:
  }
  bVar7 = true;
LAB_001806e4:
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&expected_package_prefixes);
  return bVar7;
}

Assistant:

bool ValidateObjCClassPrefixes(const std::vector<const FileDescriptor*>& files,
                               const Options& validation_options,
                               std::string* out_error) {
  // Allow a '-' as the path for the expected prefixes to completely disable
  // even the most basic of checks.
  if (validation_options.expected_prefixes_path == "-") {
    return true;
  }

  // Load the expected package prefixes, if available, to validate against.
  absl::flat_hash_map<std::string, std::string> expected_package_prefixes;
  if (!LoadExpectedPackagePrefixes(validation_options.expected_prefixes_path,
                                   &expected_package_prefixes, out_error)) {
    return false;
  }

  for (auto file : files) {
    bool should_skip =
        (std::find(validation_options.expected_prefixes_suppressions.begin(),
                   validation_options.expected_prefixes_suppressions.end(),
                   file->name()) !=
         validation_options.expected_prefixes_suppressions.end());
    if (should_skip) {
      continue;
    }

    bool is_valid =
        ValidateObjCClassPrefix(file, validation_options.expected_prefixes_path,
                                expected_package_prefixes,
                                validation_options.prefixes_must_be_registered,
                                validation_options.require_prefixes, out_error);
    if (!is_valid) {
      return false;
    }
  }
  return true;
}